

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (serializer<toml::type_config> *this,local_datetime_type *dt,
          local_datetime_format_info *fmt,source_location *param_4)

{
  char cVar1;
  char *in_RCX;
  string_type *in_RDI;
  ostringstream oss;
  size_t in_stack_000001d0;
  bool in_stack_000001df;
  local_time_type *in_stack_000001e0;
  serializer<toml::type_config> *in_stack_000001e8;
  string_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  ostringstream local_1a0 [384];
  char *local_20;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  toml::operator<<(in_stack_fffffffffffffe10,(local_date *)in_stack_fffffffffffffe08);
  cVar1 = *local_20;
  if (cVar1 == '\0') {
    std::operator<<((ostream *)local_1a0,'T');
  }
  else if (cVar1 == '\x01') {
    std::operator<<((ostream *)local_1a0,'t');
  }
  else if (cVar1 == '\x02') {
    std::operator<<((ostream *)local_1a0,' ');
  }
  else {
    std::operator<<((ostream *)local_1a0,'T');
  }
  std::__cxx11::ostringstream::str();
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe08);
  format_local_time_abi_cxx11_
            (in_stack_000001e8,in_stack_000001e0,in_stack_000001df,in_stack_000001d0);
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

string_type operator()(const local_datetime_type& dt, const local_datetime_format_info& fmt, const source_location&) // {{{
    {
        std::ostringstream oss;
        oss << dt.date;
        switch(fmt.delimiter)
        {
            case datetime_delimiter_kind::upper_T: { oss << 'T'; break; }
            case datetime_delimiter_kind::lower_t: { oss << 't'; break; }
            case datetime_delimiter_kind::space:   { oss << ' '; break; }
            default:                               { oss << 'T'; break; }
        }
        return string_conv<string_type>(oss.str()) +
            this->format_local_time(dt.time, fmt.has_seconds, fmt.subsecond_precision);
    }